

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_posix::collator<wchar_t>::do_transform_abi_cxx11_
          (collator<wchar_t> *this,char_type_conflict *b,char_type_conflict *e)

{
  size_t sVar1;
  size_type sVar2;
  wchar_t *pwVar3;
  long in_RCX;
  wchar_t *in_RDX;
  string_type *in_RDI;
  size_t n;
  vector<wchar_t,_std::allocator<wchar_t>_> buf;
  string_type s;
  locale_t in_stack_fffffffffffffed8;
  __shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffee0;
  wchar_t *in_stack_fffffffffffffee8;
  allocator *paVar4;
  allocator_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<wchar_t,_std::allocator<wchar_t>_> *in_stack_ffffffffffffff00;
  allocator local_81;
  size_t local_80;
  allocator<wchar_t> local_71;
  vector<wchar_t,_std::allocator<wchar_t>_> local_70;
  allocator local_41;
  wstring local_40 [64];
  
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_40,in_RDX,in_RCX - (long)in_RDX >> 2,&local_41);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_41);
  std::allocator<wchar_t>::allocator();
  std::vector<wchar_t,_std::allocator<wchar_t>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::allocator<wchar_t>::~allocator(&local_71);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::front
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)in_stack_fffffffffffffee0);
  std::__cxx11::wstring::c_str();
  std::vector<wchar_t,_std::allocator<wchar_t>_>::size(&local_70);
  std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffee0);
  sVar1 = coll_traits<wchar_t>::xfrm
                    ((wchar_t *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  local_80 = sVar1;
  sVar2 = std::vector<wchar_t,_std::allocator<wchar_t>_>::size(&local_70);
  if (sVar2 < sVar1) {
    std::vector<wchar_t,_std::allocator<wchar_t>_>::resize
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef0 =
         (allocator_type *)
         std::vector<wchar_t,_std::allocator<wchar_t>_>::front
                   ((vector<wchar_t,_std::allocator<wchar_t>_> *)in_stack_fffffffffffffee0);
    std::__cxx11::wstring::c_str();
    std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              (in_stack_fffffffffffffee0);
    coll_traits<wchar_t>::xfrm
              ((wchar_t *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               (size_t)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  pwVar3 = std::vector<wchar_t,_std::allocator<wchar_t>_>::front
                     ((vector<wchar_t,_std::allocator<wchar_t>_> *)in_stack_fffffffffffffee0);
  paVar4 = &local_81;
  sVar1 = local_80;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring((wstring *)in_RDI,pwVar3,sVar1,paVar4);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_81);
  std::vector<wchar_t,_std::allocator<wchar_t>_>::~vector
            ((vector<wchar_t,_std::allocator<wchar_t>_> *)in_stack_fffffffffffffef0);
  std::__cxx11::wstring::~wstring(local_40);
  return in_RDI;
}

Assistant:

virtual string_type do_transform(char_type const *b,char_type const *e) const
    {
        string_type s(b,e-b);
        std::vector<char_type> buf((e-b)*2+1);
        size_t n = coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),buf.size(),*lc_);
        if(n>buf.size()) {
            buf.resize(n);
            coll_traits<char_type>::xfrm(&buf.front(),s.c_str(),n,*lc_);
        }
        return string_type(&buf.front(),n);
    }